

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkGetRootInfo(void *arkode_mem,int *rootsfound)

{
  ARKodeRootMem pAVar1;
  long in_RSI;
  ARKodeMem in_RDI;
  ARKodeRootMem ark_root_mem;
  ARKodeMem ark_mem;
  int i;
  int local_1c;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetRootInfo","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->root_mem == (ARKodeRootMem)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode","arkGetRootInfo","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    pAVar1 = in_RDI->root_mem;
    for (local_1c = 0; local_1c < pAVar1->nrtfn; local_1c = local_1c + 1) {
      *(int *)(in_RSI + (long)local_1c * 4) = pAVar1->iroots[local_1c];
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkGetRootInfo(void *arkode_mem, int *rootsfound)
{
  int i;
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetRootInfo", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkGetRootInfo", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;
  for (i=0; i<ark_root_mem->nrtfn; i++)
    rootsfound[i] = ark_root_mem->iroots[i];
  return(ARK_SUCCESS);
}